

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O0

bool __thiscall
BamTools::Fasta::FastaPrivate::GetNameFromHeader(FastaPrivate *this,string *header,string *name)

{
  ostream *this_00;
  char *pcVar1;
  string *in_RDX;
  ulong in_RSI;
  bool bVar2;
  uint stop;
  uint start;
  uint nameLen;
  char *pName;
  string s;
  string local_88 [32];
  undefined4 local_68;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  string local_40 [32];
  string *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  std::__cxx11::string::substr((ulong)local_40,in_RSI);
  local_48 = std::__cxx11::string::data();
  local_4c = std::__cxx11::string::size();
  local_50 = 0;
  do {
    bVar2 = true;
    if (((*(char *)(local_48 + (ulong)local_50) != ' ') &&
        (bVar2 = true, *(char *)(local_48 + (ulong)local_50) != '\t')) &&
       (bVar2 = true, *(char *)(local_48 + (ulong)local_50) != '\n')) {
      bVar2 = *(char *)(local_48 + (ulong)local_50) == '\r';
    }
  } while ((bVar2) && (local_50 = local_50 + 1, local_50 != local_4c));
  local_54 = local_50;
  if (local_50 < local_4c) {
    do {
      bVar2 = false;
      if (((*(char *)(local_48 + (ulong)local_54) != ' ') &&
          (bVar2 = false, *(char *)(local_48 + (ulong)local_54) != '\t')) &&
         (bVar2 = false, *(char *)(local_48 + (ulong)local_54) != '\n')) {
        bVar2 = *(char *)(local_48 + (ulong)local_54) != '\r';
      }
    } while ((bVar2) && (local_54 = local_54 + 1, local_54 != local_4c));
  }
  bVar2 = local_50 != local_54;
  if (bVar2) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_40);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_20,pcVar1);
    std::__cxx11::string::~string(local_88);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "FASTA error : could not parse read name from FASTA header");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_68 = 1;
  local_1 = bVar2;
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool Fasta::FastaPrivate::GetNameFromHeader(const std::string& header, std::string& name)
{

    // get rid of the leading greater than sign
    std::string s = header.substr(1);

    // extract the first non-whitespace segment
    char* pName = (char*)s.data();
    unsigned int nameLen = (unsigned int)s.size();

    unsigned int start = 0;
    while ((pName[start] == 32) || (pName[start] == 9) || (pName[start] == 10) ||
           (pName[start] == 13)) {
        start++;
        if (start == nameLen) break;
    }

    unsigned int stop = start;
    if (stop < nameLen) {
        while ((pName[stop] != 32) && (pName[stop] != 9) && (pName[stop] != 10) &&
               (pName[stop] != 13)) {
            stop++;
            if (stop == nameLen) break;
        }
    }

    if (start == stop) {
        std::cerr << "FASTA error : could not parse read name from FASTA header" << std::endl;
        return false;
    }

    name = s.substr(start, stop - start).c_str();
    return true;
}